

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall TPZMatrix<Fad<double>_>::Simetrize(TPZMatrix<Fad<double>_> *this)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined8 *puVar3;
  undefined4 extraout_var_00;
  
  lVar5 = (this->super_TPZBaseMatrix).fRow;
  if (lVar5 != (this->super_TPZBaseMatrix).fCol) {
    Error("Simetrize only work for square matrices",(char *)0x0);
    lVar5 = (this->super_TPZBaseMatrix).fRow;
  }
  if (0 < lVar5) {
    lVar6 = 0;
    do {
      lVar1 = lVar6 + 1;
      for (lVar7 = lVar1; lVar7 < lVar5; lVar7 = lVar7 + 1) {
        iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                          (this,lVar6,lVar7);
        puVar3 = (undefined8 *)CONCAT44(extraout_var,iVar2);
        iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                          (this,lVar7,lVar6);
        puVar4 = (undefined8 *)CONCAT44(extraout_var_00,iVar2);
        *puVar4 = *puVar3;
        Vector<double>::operator=((Vector<double> *)(puVar4 + 1),(Vector<double> *)(puVar3 + 1));
        puVar4[3] = puVar3[3];
      }
      lVar6 = lVar1;
    } while (lVar1 != lVar5);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Simetrize() {
  
  if ( Rows() != Cols() ) {
    Error( "Simetrize only work for square matrices" );
  }
  
  int64_t row,col;
  int64_t fDim1 = Rows();
  for(row=0; row<fDim1; row++) {
    for(col=row+1; col<fDim1; col++) {
      this->s(col,row) = this->s(row,col);
    }
  }
  
}